

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtDbvt.h
# Opt level: O1

void cbtDbvt::rayTest(cbtDbvtNode *root,cbtVector3 *rayFrom,cbtVector3 *rayTo,ICollide *policy)

{
  cbtDbvtNode *pcVar1;
  undefined1 auVar2 [16];
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  undefined1 auVar7 [16];
  int iVar8;
  long lVar9;
  float *pfVar10;
  float *pfVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  undefined1 auVar18 [16];
  float fVar19;
  cbtAlignedObjectArray<const_cbtDbvtNode_*> stack;
  cbtVector3 bounds [2];
  char tempmemory [1024];
  cbtAlignedObjectArray<const_cbtDbvtNode_*> cStack_4e8;
  cbtDbvtNode **local_4c8;
  float local_4bc;
  float *local_4b8;
  float *local_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  long local_458;
  ICollide *local_450;
  float *local_448;
  float *local_440;
  cbtDbvtNode *local_438 [129];
  
  local_450 = policy;
  if (root != (cbtDbvtNode *)0x0) {
    fVar4 = rayTo->m_floats[0] - rayFrom->m_floats[0];
    fVar16 = rayTo->m_floats[1] - rayFrom->m_floats[1];
    fVar17 = rayTo->m_floats[2] - rayFrom->m_floats[2];
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)(fVar16 * fVar16)),ZEXT416((uint)fVar4),
                             ZEXT416((uint)fVar4));
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
    if (auVar7._0_4_ < 0.0) {
      local_468._0_4_ = fVar4;
      local_478._0_4_ = fVar16;
      local_488._0_4_ = fVar17;
      fVar19 = sqrtf(auVar7._0_4_);
    }
    else {
      auVar7 = vsqrtss_avx(auVar7,auVar7);
      fVar19 = auVar7._0_4_;
      local_478._0_4_ = fVar16;
      local_488._0_4_ = fVar17;
      local_468._0_4_ = fVar4;
    }
    fVar19 = 1.0 / fVar19;
    local_478._0_4_ = (float)local_478._0_4_ * fVar19;
    fVar4 = (float)local_488._0_4_ * fVar19;
    auVar18 = ZEXT816(0) << 0x40;
    uVar5 = vcmpss_avx512f(ZEXT416((uint)local_478._0_4_),auVar18,0);
    bVar6 = (bool)((byte)uVar5 & 1);
    fVar16 = (float)((uint)bVar6 * 0x5d5e0b6b + (uint)!bVar6 * (int)(1.0 / (float)local_478._0_4_));
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar4),auVar18,0);
    bVar6 = (bool)((byte)uVar5 & 1);
    fVar17 = (float)((uint)bVar6 * 0x5d5e0b6b + (uint)!bVar6 * (int)(1.0 / fVar4));
    cStack_4e8.m_ownsMemory = false;
    cStack_4e8.m_data = local_438;
    cStack_4e8.m_size = 0x80;
    cStack_4e8.m_capacity = 0x80;
    local_438[0] = root;
    fVar19 = (float)local_468._0_4_ * fVar19;
    auVar7 = vfmadd231ss_fma(ZEXT416((uint)((float)local_478._0_4_ *
                                           (rayTo->m_floats[1] - rayFrom->m_floats[1]))),
                             ZEXT416((uint)fVar19),
                             ZEXT416((uint)(rayTo->m_floats[0] - rayFrom->m_floats[0])));
    local_468 = ZEXT416((uint)fVar16);
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar19),auVar18,0);
    bVar6 = (bool)((byte)uVar5 & 1);
    auVar18._0_4_ = (float)((uint)bVar6 * 0x5d5e0b6b + (uint)!bVar6 * (int)(1.0 / fVar19));
    auVar18._4_12_ = SUB6012((undefined1  [60])0x0,0);
    local_478 = auVar18;
    local_488 = ZEXT416((uint)fVar17);
    auVar7 = vfmadd231ss_fma(auVar7,ZEXT416((uint)fVar4),
                             ZEXT416((uint)(rayTo->m_floats[2] - rayFrom->m_floats[2])));
    local_4bc = auVar7._0_4_;
    pfVar10 = (float *)(&local_4a8 + (ulong)(0.0 <= auVar18._0_4_) * 2);
    pfVar11 = (float *)((long)&local_4a8 + (ulong)(fVar16 < 0.0) * 0x10 + 4);
    local_448 = (float *)(&uStack_4a0 + (ulong)(fVar17 < 0.0) * 2);
    local_440 = (float *)(&uStack_4a0 + (ulong)(0.0 <= fVar17) * 2);
    iVar13 = 1;
    iVar12 = 0x7e;
    local_4b8 = pfVar11;
    local_4b0 = pfVar10;
    do {
      iVar8 = cStack_4e8.m_size;
      iVar14 = iVar13 + -1;
      pcVar1 = cStack_4e8.m_data[(long)iVar13 + -1];
      local_4a8 = *(undefined8 *)(pcVar1->volume).mi.m_floats;
      uStack_4a0 = *(undefined8 *)((pcVar1->volume).mi.m_floats + 2);
      local_498 = *(undefined8 *)(pcVar1->volume).mx.m_floats;
      uStack_490 = *(undefined8 *)((pcVar1->volume).mx.m_floats + 2);
      fVar4 = local_478._0_4_ *
              (*(float *)(&local_4a8 + (ulong)(auVar18._0_4_ < 0.0) * 2) - rayFrom->m_floats[0]);
      fVar17 = (float)local_468._0_4_ *
               (*(float *)((long)&local_4a8 + (ulong)(0.0 <= fVar16) * 0x10 + 4) -
               rayFrom->m_floats[1]);
      if (fVar4 <= fVar17) {
        fVar19 = local_478._0_4_ * (*pfVar10 - rayFrom->m_floats[0]);
        fVar3 = (float)local_468._0_4_ * (*pfVar11 - rayFrom->m_floats[1]);
        if (fVar3 <= fVar19) {
          auVar7 = vmaxss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar4));
          fVar4 = local_488._0_4_ * (*local_440 - rayFrom->m_floats[2]);
          if (auVar7._0_4_ <= fVar4) {
            auVar2 = vminss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar19));
            fVar17 = local_488._0_4_ * (*local_448 - rayFrom->m_floats[2]);
            if (((fVar17 <= auVar2._0_4_) &&
                (auVar7 = vmaxss_avx(ZEXT416((uint)fVar17),auVar7), auVar7._0_4_ < local_4bc)) &&
               (auVar7 = vminss_avx(ZEXT416((uint)fVar4),auVar2), 0.0 < auVar7._0_4_)) {
              if ((pcVar1->field_2).childs[1] == (cbtDbvtNode *)0x0) {
                (*local_450->_vptr_ICollide[3])(local_450,pcVar1);
                pfVar10 = local_4b0;
                pfVar11 = local_4b8;
              }
              else {
                if (iVar12 < iVar14) {
                  lVar15 = (long)cStack_4e8.m_size;
                  lVar9 = lVar15 * 2;
                  iVar12 = (int)lVar9;
                  if (cStack_4e8.m_size <= iVar12) {
                    if ((cStack_4e8.m_size < iVar12) && (cStack_4e8.m_capacity < iVar12)) {
                      local_458 = lVar9;
                      if (cStack_4e8.m_size == 0) {
                        local_4c8 = (cbtDbvtNode **)0x0;
                      }
                      else {
                        local_4c8 = (cbtDbvtNode **)cbtAlignedAllocInternal(lVar15 << 4,0x10);
                      }
                      if (0 < (long)cStack_4e8.m_size) {
                        lVar9 = 0;
                        do {
                          local_4c8[lVar9] = cStack_4e8.m_data[lVar9];
                          lVar9 = lVar9 + 1;
                        } while (cStack_4e8.m_size != lVar9);
                      }
                      if ((cStack_4e8.m_data != (cbtDbvtNode **)0x0) &&
                         (cStack_4e8.m_ownsMemory == true)) {
                        cbtAlignedFreeInternal(cStack_4e8.m_data);
                      }
                      cStack_4e8.m_ownsMemory = true;
                      cStack_4e8.m_data = local_4c8;
                      cStack_4e8.m_capacity = (int)local_458;
                      lVar9 = local_458;
                    }
                    if (iVar8 < (int)lVar9) {
                      do {
                        cStack_4e8.m_data[lVar15] = (cbtDbvtNode *)0x0;
                        lVar15 = lVar15 + 1;
                      } while ((int)lVar9 != lVar15);
                    }
                  }
                  cStack_4e8.m_size = (int)lVar9;
                  iVar12 = cStack_4e8.m_size + -2;
                }
                cStack_4e8.m_data[(long)iVar13 + -1] = (pcVar1->field_2).childs[0];
                cStack_4e8.m_data[iVar13] = (pcVar1->field_2).childs[1];
                pfVar10 = local_4b0;
                pfVar11 = local_4b8;
                iVar14 = iVar13 + 1;
              }
            }
          }
        }
      }
      iVar13 = iVar14;
    } while (iVar13 != 0);
    cbtAlignedObjectArray<const_cbtDbvtNode_*>::~cbtAlignedObjectArray(&cStack_4e8);
  }
  return;
}

Assistant:

DBVT_PREFIX
inline void cbtDbvt::rayTest(const cbtDbvtNode* root,
							const cbtVector3& rayFrom,
							const cbtVector3& rayTo,
							DBVT_IPOLICY)
{
	DBVT_CHECKTYPE
	if (root)
	{
		cbtVector3 rayDir = (rayTo - rayFrom);
		rayDir.normalize();

		///what about division by zero? --> just set rayDirection[i] to INF/BT_LARGE_FLOAT
		cbtVector3 rayDirectionInverse;
		rayDirectionInverse[0] = rayDir[0] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[0];
		rayDirectionInverse[1] = rayDir[1] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[1];
		rayDirectionInverse[2] = rayDir[2] == cbtScalar(0.0) ? cbtScalar(BT_LARGE_FLOAT) : cbtScalar(1.0) / rayDir[2];
		unsigned int signs[3] = {rayDirectionInverse[0] < 0.0, rayDirectionInverse[1] < 0.0, rayDirectionInverse[2] < 0.0};

		cbtScalar lambda_max = rayDir.dot(rayTo - rayFrom);

		cbtVector3 resultNormal;

		cbtAlignedObjectArray<const cbtDbvtNode*> stack;

		int depth = 1;
		int treshold = DOUBLE_STACKSIZE - 2;

		char tempmemory[DOUBLE_STACKSIZE * sizeof(const cbtDbvtNode*)];
#ifndef BT_DISABLE_STACK_TEMP_MEMORY
		stack.initializeFromBuffer(tempmemory, DOUBLE_STACKSIZE, DOUBLE_STACKSIZE);
#else   //BT_DISABLE_STACK_TEMP_MEMORY
		stack.resize(DOUBLE_STACKSIZE);
#endif  //BT_DISABLE_STACK_TEMP_MEMORY
		stack[0] = root;
		cbtVector3 bounds[2];
		do
		{
			const cbtDbvtNode* node = stack[--depth];

			bounds[0] = node->volume.Mins();
			bounds[1] = node->volume.Maxs();

			cbtScalar tmin = 1.f, lambda_min = 0.f;
			unsigned int result1 = cbtRayAabb2(rayFrom, rayDirectionInverse, signs, bounds, tmin, lambda_min, lambda_max);

#ifdef COMPARE_BTRAY_AABB2
			cbtScalar param = 1.f;
			bool result2 = cbtRayAabb(rayFrom, rayTo, node->volume.Mins(), node->volume.Maxs(), param, resultNormal);
			cbtAssert(result1 == result2);
#endif  //TEST_BTRAY_AABB2

			if (result1)
			{
				if (node->isinternal())
				{
					if (depth > treshold)
					{
						stack.resize(stack.size() * 2);
						treshold = stack.size() - 2;
					}
					stack[depth++] = node->childs[0];
					stack[depth++] = node->childs[1];
				}
				else
				{
					policy.Process(node);
				}
			}
		} while (depth);
	}
}